

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

int nghttp2_stream_detach_item(nghttp2_stream *stream)

{
  nghttp2_stream *stream_local;
  
  stream->item = (nghttp2_outbound_item *)0x0;
  stream->flags = stream->flags & 0xf3;
  if ((stream->flags & 0x10) == 0) {
    stream_local._4_4_ = stream_update_dep_on_detach_item(stream);
  }
  else {
    stream_local._4_4_ = 0;
  }
  return stream_local._4_4_;
}

Assistant:

int nghttp2_stream_detach_item(nghttp2_stream *stream) {
  DEBUGF("stream: stream=%d detach item=%p\n", stream->stream_id, stream->item);

  stream->item = NULL;
  stream->flags = (uint8_t)(stream->flags & ~NGHTTP2_STREAM_FLAG_DEFERRED_ALL);

  if (stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) {
    return 0;
  }

  return stream_update_dep_on_detach_item(stream);
}